

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absVta.c
# Opt level: O1

int Vta_ManObjIsUsed(Vta_Man_t *p,int iObj)

{
  uint uVar1;
  ulong uVar2;
  uint uVar3;
  
  uVar1 = p->nWords;
  uVar3 = iObj * uVar1;
  if ((-1 < (int)uVar3) && ((int)uVar3 < p->vSeens->nSize)) {
    if (0 < (int)uVar1) {
      uVar2 = 0;
      do {
        if (p->vSeens->pArray[uVar3 + uVar2] != 0) {
          return 1;
        }
        uVar2 = uVar2 + 1;
      } while (uVar1 != uVar2);
    }
    return 0;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x1af,"int *Vec_IntEntryP(Vec_Int_t *, int)");
}

Assistant:

int Vta_ManObjIsUsed( Vta_Man_t * p, int iObj )
{
    int i;
    unsigned * pInfo = (unsigned *)Vec_IntEntryP( p->vSeens, p->nWords * iObj );
    for ( i = 0; i < p->nWords; i++ )
        if ( pInfo[i] )
            return 1;
    return 0;
}